

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_2,_5,_0,_5>::evaluate
               (ShaderEvalContext *evalCtx)

{
  VecAccess<float,_4,_3> local_78;
  Matrix<float,_2,_2> local_4c;
  Matrix<float,_2,_2> local_3c;
  Mat2 local_2c;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<2,5>((MatrixCaseUtils *)&local_3c,evalCtx,0);
  getInputValue<0,5>((MatrixCaseUtils *)&local_4c,local_10,1);
  tcu::operator-((tcu *)&local_2c,&local_3c,&local_4c);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_1c,&local_2c);
  tcu::Vector<float,_4>::xyz(&local_78,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,&local_1c);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_2c);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_4c);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}